

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adl_lsp_server.h
# Opt level: O2

void lscpp::experimental::launch<my_lsp_server::server>(server *server,transporter *transporter_)

{
  void *__stat_loc;
  future<void> rcv;
  
  __stat_loc = (void *)0x1;
  std::
  async<lscpp::experimental::launch<my_lsp_server::server>(my_lsp_server::server&&,lscpp::transporter&&)::_lambda()_1_>
            ((launch)&rcv,(anon_class_16_2_440fc4b3_for__M_head_impl *)0x1);
  std::__basic_future<void>::wait(&rcv.super___basic_future<void>,__stat_loc);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rcv.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void launch(Server &&server, transporter &&transporter_) {

  // Allows to attach a debugger,
  // before the language server starts to communicate with the client.
  //   std::this_thread::sleep_for(std::chrono::seconds(config.startup_delay));

  auto rcv = std::async(std::launch::async, [&]() {
    while (true) {
      auto header = parse_header(transporter_);

      if (header.content_length <
          0) { // TODO parse header should not use -1 to report an error
        continue;
      }
      auto msg = transporter_.read_message(header.content_length);

      auto result = lscpp_handle_message(server, msg);
      if (result) {
        write_lsp_message(transporter_, *result);
      }
    }
  });

  rcv.wait();
}